

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::ParamDict(ParamDict *this,ParamDict *rhs)

{
  int iVar1;
  int *piVar2;
  ParamDictPrivate *in_RSI;
  Mat *in_RDI;
  int type;
  int i;
  Mat *this_00;
  int local_20;
  
  in_RDI->data = &PTR__ParamDict_0099b500;
  this_00 = (Mat *)&in_RDI->refcount;
  piVar2 = (int *)operator_new(0xa00);
  ParamDictPrivate::ParamDictPrivate(in_RSI);
  this_00->data = piVar2;
  for (local_20 = 0; local_20 < 0x20; local_20 = local_20 + 1) {
    iVar1 = *(int *)((long)in_RSI->params[0].v.data + (long)local_20 * 0x50);
    in_RDI->refcount[(long)local_20 * 0x14] = iVar1;
    if (((iVar1 == 1) || (iVar1 == 2)) || (iVar1 == 3)) {
      in_RDI->refcount[(long)local_20 * 0x14 + 1] =
           *(int *)((long)in_RSI->params[0].v.data + (long)local_20 * 0x50 + 4);
    }
    else {
      ncnn::Mat::operator=(this_00,in_RDI);
    }
  }
  return;
}

Assistant:

ParamDict::ParamDict(const ParamDict& rhs)
    : d(new ParamDictPrivate)
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        int type = rhs.d->params[i].type;
        d->params[i].type = type;
        if (type == 1 || type == 2 || type == 3)
        {
            d->params[i].i = rhs.d->params[i].i;
        }
        else // if (type == 4 || type == 5 || type == 6)
        {
            d->params[i].v = rhs.d->params[i].v;
        }
    }
}